

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::shader_stage_mask_is_supported(Impl *this,VkShaderStageFlags stages)

{
  bool bVar1;
  
  bVar1 = true;
  if ((stages != 0x1f) && (stages != 0x7fffffff)) {
    if (((stages < 0x4000) &&
        ((stages < 0x100 || ((this->features).ray_tracing_pipeline.rayTracingPipeline != 0)))) &&
       ((-1 < (char)stages ||
        (((this->features).mesh_shader.meshShader != 0 ||
         ((this->features).mesh_shader_nv.meshShader != 0)))))) {
      return ((this->features).mesh_shader_nv.taskShader != 0 ||
             (this->features).mesh_shader.taskShader != 0) || (stages & 0x40) == 0;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FeatureFilter::Impl::shader_stage_mask_is_supported(VkShaderStageFlags stages) const
{
	if (stages == VK_SHADER_STAGE_ALL || stages == VK_SHADER_STAGE_ALL_GRAPHICS)
		return true;

	constexpr VkShaderStageFlags supported_flags =
			VK_SHADER_STAGE_VERTEX_BIT |
			VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT |
			VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT |
			VK_SHADER_STAGE_GEOMETRY_BIT |
			VK_SHADER_STAGE_FRAGMENT_BIT |
			VK_SHADER_STAGE_COMPUTE_BIT |
			VK_SHADER_STAGE_RAYGEN_BIT_KHR |
			VK_SHADER_STAGE_CALLABLE_BIT_KHR |
			VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR |
			VK_SHADER_STAGE_MISS_BIT_KHR |
			VK_SHADER_STAGE_ANY_HIT_BIT_KHR |
			VK_SHADER_STAGE_INTERSECTION_BIT_KHR |
			VK_SHADER_STAGE_MESH_BIT_EXT |
			VK_SHADER_STAGE_TASK_BIT_EXT;

	if (stages & ~supported_flags)
		return false;

	if ((stages & (VK_SHADER_STAGE_RAYGEN_BIT_KHR |
	               VK_SHADER_STAGE_CALLABLE_BIT_KHR |
	               VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR |
	               VK_SHADER_STAGE_MISS_BIT_KHR |
	               VK_SHADER_STAGE_ANY_HIT_BIT_KHR |
	               VK_SHADER_STAGE_INTERSECTION_BIT_KHR)) != 0 &&
	    features.ray_tracing_pipeline.rayTracingPipeline == VK_FALSE)
	{
		return false;
	}

	if ((stages & VK_SHADER_STAGE_MESH_BIT_EXT) != 0 &&
	    features.mesh_shader.meshShader == VK_FALSE &&
	    features.mesh_shader_nv.meshShader == VK_FALSE)
		return false;

	if ((stages & VK_SHADER_STAGE_TASK_BIT_EXT) != 0 &&
	    features.mesh_shader.taskShader == VK_FALSE &&
	    features.mesh_shader_nv.taskShader == VK_FALSE)
		return false;

	return true;
}